

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::TriangleDerivateCase::iterate(TriangleDerivateCase *this)

{
  Vec4 *vec;
  string *psVar1;
  deUint32 *this_00;
  deUint32 *this_01;
  _Rb_tree_header *this_02;
  DataType dataType;
  SurfaceType SVar2;
  int iVar3;
  RenderContext *pRVar4;
  TestLog *pTVar5;
  int iVar6;
  deUint32 dVar7;
  GLenum GVar8;
  GLint GVar9;
  GLint GVar10;
  undefined4 extraout_var;
  mapped_type *pmVar12;
  RenderTarget *pRVar13;
  MessageBuilder *this_03;
  TestError *pTVar14;
  glUniform3fvFunc *pp_Var15;
  _Rb_tree_color _Var16;
  size_t __n;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  byte bVar17;
  int iVar18;
  long lVar19;
  IVec2 viewportSize;
  GLint local_800;
  GLint local_7fc;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  Vec4 *local_7f0;
  undefined4 local_7e4;
  AutoRbo rbo;
  deUint16 indices [6];
  TextureLevel result;
  AutoFbo fbo;
  Surface errorMask;
  TextureFormat transferFormat;
  Random rnd;
  string local_728;
  AutoFbo resFbo;
  VertexArrayBinding vertexArrays [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertexParams;
  AutoRbo resRbo;
  ShaderProgram program;
  Functions *pFVar11;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar11 = (Functions *)CONCAT44(extraout_var,iVar6);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  dataType = this->m_coordDataType;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vertexParams._M_t._M_impl.super__Rb_tree_header._M_header;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getPrecisionName(this->m_coordPrecision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resFbo,"PRECISION",(allocator<char> *)&resRbo);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vertexParams,(key_type *)&resFbo);
  std::__cxx11::string::assign((char *)pmVar12);
  std::__cxx11::string::~string((string *)&resFbo);
  glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resFbo,"DATATYPE",(allocator<char> *)&resRbo);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vertexParams,(key_type *)&resFbo);
  std::__cxx11::string::assign((char *)pmVar12);
  std::__cxx11::string::~string((string *)&resFbo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resRbo,
             "#version 300 es\nin highp vec4 a_position;\nin ${PRECISION} ${DATATYPE} a_coord;\nout ${PRECISION} ${DATATYPE} v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,(allocator<char> *)indices);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&resFbo,(string *)&resRbo);
  tcu::StringTemplate::specialize((string *)&result,(StringTemplate *)&resFbo,&vertexParams);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&resFbo);
  std::__cxx11::string::~string((string *)&resRbo);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vertexParams._M_t);
  glu::makeVtxFragSources((ProgramSources *)vertexArrays,(string *)&result,&this->m_fragmentSrc);
  glu::ShaderProgram::ShaderProgram(&program,pRVar4,(ProgramSources *)vertexArrays);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  std::__cxx11::string::~string((string *)&result);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar7 ^ 0xbbc24);
  SVar2 = this->m_surfaceType;
  _Var16 = 0x8058;
  if (SVar2 == SURFACETYPE_FLOAT_FBO) {
    _Var16 = 0x8d70;
  }
  getViewportSize((TriangleDerivateCase *)&viewportSize);
  local_7fc = 0;
  local_800 = 0;
  if (SVar2 == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_7fc = de::Random::getInt(&rnd,0,pRVar13->m_width - viewportSize.m_data[0]);
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_800 = de::Random::getInt(&rnd,0,pRVar13->m_height - viewportSize.m_data[1]);
  }
  fbo.m_fbo = 0;
  rbo.m_rbo = 0;
  rbo.m_gl = pFVar11;
  fbo.m_gl = pFVar11;
  tcu::TextureLevel::TextureLevel(&result);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
               ,0x296);
LAB_010ee5e3:
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_7e4 = SVar2;
  if (SVar2 == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar6 = (pRVar13->m_pixelFormat).redBits;
    iVar18 = (pRVar13->m_pixelFormat).greenBits;
    iVar3 = (pRVar13->m_pixelFormat).blueBits;
    local_7f0 = (Vec4 *)CONCAT44(local_7f0._4_4_,(pRVar13->m_pixelFormat).alphaBits);
    vertexArrays[0].binding._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Rendering to default framebuffer\n");
    std::operator<<((ostream *)psVar1,"\tColor depth: R=");
    std::ostream::operator<<(psVar1,iVar6);
    std::operator<<((ostream *)psVar1,", G=");
    std::ostream::operator<<(psVar1,iVar18);
    std::operator<<((ostream *)psVar1,", B=");
    std::ostream::operator<<(psVar1,iVar3);
    std::operator<<((ostream *)psVar1,", A=");
    std::ostream::operator<<(psVar1,(int)local_7f0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  }
  else {
    vertexArrays[0].binding._0_8_ =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    psVar1 = &vertexArrays[0].binding.name;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
    std::operator<<((ostream *)psVar1,"Rendering to FBO, format = ");
    vertexParams._M_t._M_impl._0_8_ = glu::getTextureFormatName;
    vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var16;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&vertexParams,(ostream *)psVar1);
    std::operator<<((ostream *)psVar1,", samples = ");
    this_03 = tcu::MessageBuilder::operator<<((MessageBuilder *)vertexArrays,&this->m_numSamples);
    tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
    (*(fbo.m_gl)->genFramebuffers)(1,&fbo.m_fbo);
    (*(rbo.m_gl)->genRenderbuffers)(1,&rbo.m_rbo);
    (*pFVar11->bindRenderbuffer)(0x8d41,rbo.m_rbo);
    (*pFVar11->renderbufferStorageMultisample)
              (0x8d41,this->m_numSamples,_Var16,viewportSize.m_data[0],viewportSize.m_data[1]);
    (*pFVar11->bindFramebuffer)(0x8d40,fbo.m_fbo);
    (*pFVar11->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo.m_rbo);
    GVar8 = (*pFVar11->checkFramebufferStatus)(0x8d40);
    if (GVar8 != 0x8cd5) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                 ,0x2a6);
      goto LAB_010ee5e3;
    }
  }
  resRbo.m_gl = (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = &resRbo.m_rbo;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"in: ");
  tcu::operator<<((ostream *)this_00,&this->m_coordMin);
  std::operator<<((ostream *)this_00," -> ");
  tcu::operator<<((ostream *)this_00,&this->m_coordMax);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"v_coord.x = in.x * x\n");
  std::operator<<((ostream *)this_00,"v_coord.y = in.y * y\n");
  std::operator<<((ostream *)this_00,"v_coord.z = in.z * (x+y)/2\n");
  std::operator<<((ostream *)this_00,"v_coord.w = in.w * (1 - (x+y)/2)\n");
  resFbo.m_gl = (Functions *)
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&resRbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_01 = &resFbo.m_fbo;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"u_scale: ");
  local_7f0 = &this->m_derivScale;
  tcu::operator<<((ostream *)this_01,local_7f0);
  std::operator<<((ostream *)this_01,", u_bias: ");
  vec = &this->m_derivBias;
  tcu::operator<<((ostream *)this_01,vec);
  std::operator<<((ostream *)this_01," (displayed values have scale/bias removed)");
  vertexParams._M_t._M_impl._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&resFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_02 = &vertexParams._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
  std::operator<<((ostream *)this_02,"Viewport: ");
  std::ostream::operator<<(this_02,viewportSize.m_data[0]);
  std::operator<<((ostream *)this_02,"x");
  std::ostream::operator<<(this_02,viewportSize.m_data[1]);
  vertexArrays[0].binding._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&vertexParams,(EndMessageToken *)&tcu::TestLog::EndMessage);
  psVar1 = &vertexArrays[0].binding.name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"GL_FRAGMENT_SHADER_DERIVATE_HINT: ");
  indices._8_4_ = this->m_hint;
  indices._0_8_ = glu::getHintModeName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)indices,(ostream *)psVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)vertexArrays,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0xbf8000003f800000
  ;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x3f80000000000000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x3f800000bf800000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x3f80000000000000;
  vertexParams._M_t._M_impl._0_8_ = 0xbf800000bf800000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  resFbo.m_gl = *(Functions **)(this->m_coordMin).m_data;
  resFbo.m_fbo = (deUint32)*(undefined8 *)((this->m_coordMin).m_data + 2);
  resFbo._12_4_ = SUB84((ulong)*(undefined8 *)((this->m_coordMax).m_data + 2) >> 0x20,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resRbo,"a_position",(allocator<char> *)&transferFormat);
  glu::va::Float(vertexArrays,(string *)&resRbo,4,4,0,(float *)&vertexParams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,"a_coord",(allocator<char> *)&local_728);
  glu::va::Float(vertexArrays + 1,(string *)indices,4,4,0,(float *)&resFbo);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&resRbo);
  indices[0] = 0;
  indices[1] = 2;
  indices[2] = 1;
  indices[3] = 2;
  indices[4] = 3;
  indices[5] = 1;
  (*pFVar11->clearColor)(0.125,0.25,0.5,1.0);
  (*pFVar11->clear)(0x4500);
  (*pFVar11->disable)(0xbd0);
  (*pFVar11->useProgram)(program.m_program.m_program);
  GVar9 = (*pFVar11->getUniformLocation)(program.m_program.m_program,"u_scale");
  GVar10 = (*pFVar11->getUniformLocation)(program.m_program.m_program,"u_bias");
  switch(this->m_dataType) {
  case TYPE_FLOAT:
    (*pFVar11->uniform1f)(GVar9,local_7f0->m_data[0]);
    (*pFVar11->uniform1f)(GVar10,vec->m_data[0]);
    goto switchD_010edee5_default;
  case TYPE_FLOAT_VEC2:
    (*pFVar11->uniform2fv)(GVar9,1,local_7f0->m_data);
    pp_Var15 = &pFVar11->uniform2fv;
    break;
  case TYPE_FLOAT_VEC3:
    (*pFVar11->uniform3fv)(GVar9,1,local_7f0->m_data);
    pp_Var15 = &pFVar11->uniform3fv;
    break;
  case TYPE_FLOAT_VEC4:
    (*pFVar11->uniform4fv)(GVar9,1,local_7f0->m_data);
    pp_Var15 = &pFVar11->uniform4fv;
    break;
  default:
    goto switchD_010edee5_default;
  }
  (**pp_Var15)(GVar10,1,vec->m_data);
switchD_010edee5_default:
  deqp::gls::setupDefaultUniforms
            (((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)program.m_program.m_program);
  (*pFVar11->hint)(0x8b8b,this->m_hint);
  GVar8 = (*pFVar11->getError)();
  glu::checkError(GVar8,"Setup program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x2fd);
  (*pFVar11->viewport)(local_7fc,local_800,viewportSize.m_data[0],viewportSize.m_data[1]);
  resRbo.m_gl = (Functions *)0x600000000;
  resRbo.m_rbo = 1;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,2,
            vertexArrays,(PrimitiveList *)&resRbo,(DrawUtilCallback *)0x0);
  GVar8 = (*pFVar11->getError)();
  glu::checkError(GVar8,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x302);
  lVar19 = 0x58;
  do {
    std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar19));
    lVar19 = lVar19 + -0x50;
  } while (lVar19 != -0x48);
  resFbo.m_fbo = 0;
  resRbo.m_rbo = 0;
  resFbo.m_gl = pFVar11;
  resRbo.m_gl = pFVar11;
  if ((local_7e4 != SURFACETYPE_DEFAULT_FRAMEBUFFER) && (0 < this->m_numSamples)) {
    (*pFVar11->genFramebuffers)(1,&resFbo.m_fbo);
    (*(resRbo.m_gl)->genRenderbuffers)(1,&resRbo.m_rbo);
    (*pFVar11->bindRenderbuffer)(0x8d41,resRbo.m_rbo);
    (*pFVar11->renderbufferStorageMultisample)
              (0x8d41,0,_Var16,viewportSize.m_data[0],viewportSize.m_data[1]);
    (*pFVar11->bindFramebuffer)(0x8ca9,resFbo.m_fbo);
    (*pFVar11->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,resRbo.m_rbo);
    GVar8 = (*pFVar11->checkFramebufferStatus)(0x8d40);
    if (GVar8 != 0x8cd5) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                 ,0x315);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pFVar11->blitFramebuffer)
              (0,0,viewportSize.m_data[0],viewportSize.m_data[1],0,0,viewportSize.m_data[0],
               viewportSize.m_data[1],0x4000,0x2600);
    GVar8 = (*pFVar11->getError)();
    glu::checkError(GVar8,"Resolve blit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                    ,0x318);
    (*pFVar11->bindFramebuffer)(0x8ca8,resFbo.m_fbo);
  }
  if (this->m_surfaceType < SURFACETYPE_FLOAT_FBO) {
    vertexArrays[0].binding.type = 8;
    vertexArrays[0].binding._4_4_ = 3;
    tcu::TextureLevel::setStorage
              (&result,(TextureFormat *)vertexArrays,viewportSize.m_data[0],viewportSize.m_data[1],1
              );
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)vertexArrays,&result);
    glu::readPixels(pRVar4,local_7fc,local_800,(PixelBufferAccess *)vertexArrays);
  }
  else if (this->m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    indices[0] = 8;
    indices[1] = 0;
    indices[2] = 0x23;
    indices[3] = 0;
    transferFormat.order = RGBA;
    transferFormat.type = UNSIGNED_INT32;
    tcu::TextureLevel::setStorage
              (&result,(TextureFormat *)indices,viewportSize.m_data[0],viewportSize.m_data[1],1);
    iVar18 = result.m_size.m_data[1];
    iVar6 = result.m_size.m_data[0];
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertexParams,&result);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)vertexArrays,&transferFormat,iVar6,iVar18,
               result.m_size.m_data[2],
               vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    glu::readPixels(pRVar4,local_7fc,local_800,(PixelBufferAccess *)vertexArrays);
  }
  GVar8 = (*pFVar11->getError)();
  __n = 0x334;
  glu::checkError(GVar8,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x334);
  anon_unknown_6::AutoRbo::~AutoRbo(&resRbo);
  anon_unknown_6::AutoFbo::~AutoFbo(&resFbo);
  tcu::Surface::Surface(&errorMask,result.m_size.m_data[0],result.m_size.m_data[1]);
  tcu::Surface::getAccess((PixelBufferAccess *)vertexArrays,&errorMask);
  resFbo.m_gl = (Functions *)CONCAT44(resFbo.m_gl._4_4_,0xff00ff00);
  tcu::RGBA::toVec((RGBA *)&resFbo);
  tcu::clear((PixelBufferAccess *)vertexArrays,(Vec4 *)&vertexParams);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)vertexArrays,&result);
  tcu::Surface::getAccess((PixelBufferAccess *)&vertexParams,&errorMask);
  iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                    (this,vertexArrays,&vertexParams);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&resRbo,"Result",&local_7f1);
  std::__cxx11::string::string<std::allocator<char>>((string *)indices,"Result images",&local_7f2);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&vertexParams,(string *)&resRbo,(string *)indices);
  iVar18 = (int)pTVar5;
  tcu::LogImageSet::write((LogImageSet *)&vertexParams,iVar18,__buf,__n);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transferFormat,"Rendered",&local_7f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Rendered image",&local_7f4);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&resFbo,&result);
  access = (ConstPixelBufferAccess *)&resFbo;
  tcu::LogImage::LogImage
            ((LogImage *)vertexArrays,(string *)&transferFormat,&local_728,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)vertexArrays,iVar18,__buf_00,(size_t)access);
  tcu::LogImage::~LogImage((LogImage *)vertexArrays);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&transferFormat);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&vertexParams);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&resRbo);
  bVar17 = (byte)iVar6;
  if (bVar17 == 0) {
    pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexParams,"ErrorMask",(allocator<char> *)&resRbo);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resFbo,"Error mask",(allocator<char> *)indices);
    surface = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)vertexArrays,(string *)&vertexParams,(string *)&resFbo,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)vertexArrays,(int)pTVar5,__buf_01,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)vertexArrays);
    std::__cxx11::string::~string((string *)&resFbo);
    std::__cxx11::string::~string((string *)&vertexParams);
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Image comparison failed";
  if (bVar17 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar17 ^ 1),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::TextureLevel::~TextureLevel(&result);
  anon_unknown_6::AutoRbo::~AutoRbo(&rbo);
  anon_unknown_6::AutoFbo::~AutoFbo(&fbo);
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

TriangleDerivateCase::IterateResult TriangleDerivateCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(genVertexSource(m_coordDataType, m_coordPrecision), m_fragmentSrc));
	de::Random					rnd				(deStringHash(getName()) ^ 0xbbc24);
	const bool					useFbo			= m_surfaceType != SURFACETYPE_DEFAULT_FRAMEBUFFER;
	const deUint32				fboFormat		= m_surfaceType == SURFACETYPE_FLOAT_FBO ? GL_RGBA32UI : GL_RGBA8;
	const tcu::IVec2			viewportSize	= getViewportSize();
	const int					viewportX		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getWidth()		- viewportSize.x());
	const int					viewportY		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getHeight()	- viewportSize.y());
	AutoFbo						fbo				(gl);
	AutoRbo						rbo				(gl);
	tcu::TextureLevel			result;

	m_testCtx.getLog() << program;

	if (!program.isOk())
		TCU_FAIL("Compile failed");

	if (useFbo)
	{
		m_testCtx.getLog() << TestLog::Message
						   << "Rendering to FBO, format = " << glu::getTextureFormatStr(fboFormat)
						   << ", samples = " << m_numSamples
						   << TestLog::EndMessage;

		fbo.gen();
		rbo.gen();

		gl.bindRenderbuffer(GL_RENDERBUFFER, *rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, fboFormat, viewportSize.x(), viewportSize.y());
		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *rbo);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}
	else
	{
		const tcu::PixelFormat pixelFormat = m_context.getRenderTarget().getPixelFormat();

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Rendering to default framebuffer\n"
			<< "\tColor depth: R=" << pixelFormat.redBits << ", G=" << pixelFormat.greenBits << ", B=" << pixelFormat.blueBits << ", A=" << pixelFormat.alphaBits
			<< TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "in: " << m_coordMin << " -> " << m_coordMax << "\n"
										   << "v_coord.x = in.x * x\n"
										   << "v_coord.y = in.y * y\n"
										   << "v_coord.z = in.z * (x+y)/2\n"
										   << "v_coord.w = in.w * (1 - (x+y)/2)\n"
					   << TestLog::EndMessage
					   << TestLog::Message << "u_scale: " << m_derivScale << ", u_bias: " << m_derivBias << " (displayed values have scale/bias removed)" << TestLog::EndMessage
					   << TestLog::Message << "Viewport: " << viewportSize.x() << "x" << viewportSize.y() << TestLog::EndMessage
					   << TestLog::Message << "GL_FRAGMENT_SHADER_DERIVATE_HINT: " << glu::getHintModeStr(m_hint) << TestLog::EndMessage;

	// Draw
	{
		const float positions[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f,  1.0f, 0.0f, 1.0f,
			 1.0f, -1.0f, 0.0f, 1.0f,
			 1.0f,  1.0f, 0.0f, 1.0f
		};
		const float coords[] =
		{
			m_coordMin.x(), m_coordMin.y(), m_coordMin.z(),							m_coordMax.w(),
			m_coordMin.x(), m_coordMax.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMin.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMax.y(), m_coordMax.z(),							m_coordMin.w()
		};
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4, 4, 0, &positions[0]),
			glu::va::Float("a_coord",		4, 4, 0, &coords[0])
		};
		const deUint16 indices[] = { 0, 2, 1, 2, 3, 1 };

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DITHER);

		gl.useProgram(program.getProgram());

		{
			const int	scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			const int	biasLoc		= gl.getUniformLocation(program.getProgram(), "u_bias");

			switch (m_dataType)
			{
				case glu::TYPE_FLOAT:
					gl.uniform1f(scaleLoc, m_derivScale.x());
					gl.uniform1f(biasLoc, m_derivBias.x());
					break;

				case glu::TYPE_FLOAT_VEC2:
					gl.uniform2fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform2fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC3:
					gl.uniform3fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform3fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC4:
					gl.uniform4fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform4fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				default:
					DE_ASSERT(false);
			}
		}

		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());
		setupRenderState(program.getProgram());

		gl.hint(GL_FRAGMENT_SHADER_DERIVATIVE_HINT, m_hint);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup program state");

		gl.viewport(viewportX, viewportY, viewportSize.x(), viewportSize.y());
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
	}

	// Read back results
	{
		const bool		isMSAA		= useFbo && m_numSamples > 0;
		AutoFbo			resFbo		(gl);
		AutoRbo			resRbo		(gl);

		// Resolve if necessary
		if (isMSAA)
		{
			resFbo.gen();
			resRbo.gen();

			gl.bindRenderbuffer(GL_RENDERBUFFER, *resRbo);
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 0, fboFormat, viewportSize.x(), viewportSize.y());
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *resFbo);
			gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *resRbo);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			gl.blitFramebuffer(0, 0, viewportSize.x(), viewportSize.y(), 0, 0, viewportSize.x(), viewportSize.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Resolve blit");

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *resFbo);
		}

		switch (m_surfaceType)
		{
			case SURFACETYPE_DEFAULT_FRAMEBUFFER:
			case SURFACETYPE_UNORM_FBO:
				result.setStorage(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, result);
				break;

			case SURFACETYPE_FLOAT_FBO:
			{
				const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
				const tcu::TextureFormat	transferFormat	(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);

				result.setStorage(dataFormat, viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY,
								tcu::PixelBufferAccess(transferFormat, result.getWidth(), result.getHeight(), result.getDepth(), result.getAccess().getDataPtr()));
				break;
			}

			default:
				DE_ASSERT(false);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");
	}

	// Verify
	{
		tcu::Surface errorMask(result.getWidth(), result.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(result.getAccess(), errorMask.getAccess());

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Result images")
						   << TestLog::Image("Rendered", "Rendered image", result);

		if (!isOk)
			m_testCtx.getLog() << TestLog::Image("ErrorMask", "Error mask", errorMask);

		m_testCtx.getLog() << TestLog::EndImageSet;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}